

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AssignmentPatternItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AssignmentPatternItemSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,ExpressionSyntax *args_2)

{
  Token colon;
  AssignmentPatternItemSyntax *this_00;
  ExpressionSyntax *args_local_2;
  Token *args_local_1;
  ExpressionSyntax *args_local;
  BumpAllocator *this_local;
  
  this_00 = (AssignmentPatternItemSyntax *)allocate(this,0x30,8);
  colon.kind = args_1->kind;
  colon._2_1_ = args_1->field_0x2;
  colon.numFlags.raw = (args_1->numFlags).raw;
  colon.rawLen = args_1->rawLen;
  colon.info = args_1->info;
  slang::syntax::AssignmentPatternItemSyntax::AssignmentPatternItemSyntax(this_00,args,colon,args_2)
  ;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }